

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O0

int mg_map_equal(mg_map *lhs,mg_map *rhs)

{
  int iVar1;
  mg_value *in_RSI;
  mg_value_type *in_RDI;
  uint32_t i;
  mg_string *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  mg_value_type mVar2;
  int local_4;
  
  if (*in_RDI == in_RSI->type) {
    for (mVar2 = MG_VALUE_TYPE_NULL; mVar2 < *in_RDI; mVar2 = mVar2 + MG_VALUE_TYPE_BOOL) {
      iVar1 = mg_string_equal(in_stack_ffffffffffffffd8,(mg_string *)0x111037);
      if (iVar1 == 0) {
        return 0;
      }
      iVar1 = mg_value_equal(in_RSI,(mg_value *)CONCAT44(mVar2,in_stack_ffffffffffffffe0));
      if (iVar1 == 0) {
        return 0;
      }
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mg_map_equal(const mg_map *lhs, const mg_map *rhs) {
  if (lhs->size != rhs->size) {
    return 0;
  }
  for (uint32_t i = 0; i < lhs->size; ++i) {
    if (!mg_string_equal(lhs->keys[i], rhs->keys[i])) return 0;
    if (!mg_value_equal(lhs->values[i], rhs->values[i])) return 0;
  }
  return 1;
}